

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O0

void __thiscall Chip8::LoadROM(Chip8 *this,string *filename)

{
  _Ios_Openmode _Var1;
  uint64_t uVar2;
  uint8_t *puVar3;
  fpos local_230 [16];
  char local_220 [8];
  ifstream file;
  string *filename_local;
  Chip8 *this_local;
  
  _Var1 = std::operator|(_S_ate,_S_bin);
  std::ifstream::ifstream(local_220,(string *)filename,_Var1);
  local_230 = (fpos  [16])std::istream::tellg();
  uVar2 = std::fpos::operator_cast_to_long(local_230);
  this->size = uVar2;
  puVar3 = (uint8_t *)operator_new__(this->size);
  this->memory = puVar3;
  std::istream::seekg((long)local_220,_S_beg);
  std::istream::read(local_220,(long)this->memory);
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void Chip8::LoadROM(std::string filename) {
    std::ifstream file(filename, std::ios::ate | std::ios::binary);
    size = file.tellg();
    memory = new uint8_t [size];
    file.seekg(0, std::ios::beg);
    file.read(reinterpret_cast<char *>(memory), size);



    file.close();
}